

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O3

LabelInstr * Peeps::RetargetBrToBr(BranchInstr *branchInstr,LabelInstr *targetInstr)

{
  Opnd *pOVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  OpCode OVar5;
  undefined4 *puVar6;
  Instr *instr;
  LabelInstr *pLVar7;
  Instr *pIVar8;
  MultiBranchInstr *branchRef;
  char cVar9;
  uint uVar10;
  LabelInstr *local_40;
  
  if (targetInstr == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,0x31b,"(targetInstr)","targetInstr");
    if (!bVar3) goto LAB_0061e394;
    *puVar6 = 0;
  }
  instr = IR::Instr::GetNextRealInstr(&targetInstr->super_Instr);
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,0x31d,"(targetInstrNext)","GetNextRealInstr() failed to get next target");
    if (!bVar3) {
LAB_0061e394:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  if (((branchInstr->super_Instr).m_opcode < ADD) || (instr->m_kind != InstrKindBranch)) {
    return targetInstr;
  }
  uVar10 = 1;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  local_40 = (LabelInstr *)0x0;
  do {
    OVar5 = instr->m_opcode;
    if (OVar5 < ADD) {
      if ((OVar5 != Br) && (OVar5 != MultiBr)) {
LAB_0061dfaa:
        if (OVar5 != (branchInstr->super_Instr).m_opcode) {
          return targetInstr;
        }
        pOVar1 = (branchInstr->super_Instr).m_src1;
        if (pOVar1 == (Opnd *)0x0) {
LAB_0061dfdf:
          if (instr->m_src1 != (Opnd *)0x0) {
            return targetInstr;
          }
        }
        else {
          if (instr->m_src1 == (Opnd *)0x0) {
            return targetInstr;
          }
          bVar3 = IR::Opnd::IsEqual(pOVar1,instr->m_src1);
          if (!bVar3) {
            if ((branchInstr->super_Instr).m_src1 != (Opnd *)0x0) {
              return targetInstr;
            }
            goto LAB_0061dfdf;
          }
        }
        pOVar1 = (branchInstr->super_Instr).m_src2;
        if (pOVar1 != (Opnd *)0x0) {
          if (instr->m_src2 == (Opnd *)0x0) {
            return targetInstr;
          }
          bVar3 = IR::Opnd::IsEqual(pOVar1,instr->m_src2);
          if (bVar3) goto LAB_0061e022;
          if ((branchInstr->super_Instr).m_src2 != (Opnd *)0x0) {
            return targetInstr;
          }
        }
        if (instr->m_src2 != (Opnd *)0x0) {
          return targetInstr;
        }
      }
    }
    else {
      bVar3 = LowererMD::IsUnconditionalBranch(instr);
      if (!bVar3) {
        OVar5 = instr->m_opcode;
        goto LAB_0061dfaa;
      }
    }
LAB_0061e022:
    if ((targetInstr->field_0x78 & 1) != 0) {
      if (instr->m_opcode < ADD) {
        return targetInstr;
      }
      bVar3 = targetInstr == local_40;
      local_40 = targetInstr;
      if (bVar3) {
        return targetInstr;
      }
    }
    pLVar7 = branchInstr->m_branchTarget;
    cVar9 = branchInstr->m_isMultiBranch;
    if (pLVar7 == (LabelInstr *)0x0) {
LAB_0061e117:
      if (cVar9 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x20e,"(m_isMultiBranch)","m_isMultiBranch");
        if (!bVar3) goto LAB_0061e394;
        *puVar6 = 0;
      }
    }
    else {
      if ((bool)cVar9 != false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x209,"(!m_isMultiBranch)","!m_isMultiBranch");
        if (!bVar3) goto LAB_0061e394;
        *puVar6 = 0;
        pLVar7 = branchInstr->m_branchTarget;
      }
      if ((pLVar7->field_0x78 & 0x20) != 0) {
        pIVar8 = instr[1].m_next;
        cVar9 = *(char *)((long)&instr[1]._vptr_Instr + 1);
        if (pIVar8 == (Instr *)0x0) goto LAB_0061e117;
        if (cVar9 != '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x209,"(!m_isMultiBranch)","!m_isMultiBranch");
          if (!bVar3) goto LAB_0061e394;
          *puVar6 = 0;
          pIVar8 = instr[1].m_next;
        }
        *(byte *)&pIVar8[1].m_func = *(byte *)&pIVar8[1].m_func | 0x20;
      }
    }
    if (9999 < uVar10) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                         ,0x380,"(++counter < 10000)","We should not be looping this many times!");
      if (!bVar3) goto LAB_0061e394;
      *puVar6 = 0;
    }
    pLVar7 = (LabelInstr *)instr[1].m_next;
    if (pLVar7 == (LabelInstr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                         ,900,"(reTargetLabel)","reTargetLabel");
      if (!bVar3) goto LAB_0061e394;
      *puVar6 = 0;
    }
    if (targetInstr == pLVar7) {
      return targetInstr;
    }
    bVar4 = branchInstr->m_isMultiBranch;
    if (branchInstr->m_branchTarget == (LabelInstr *)0x0) {
      if ((bool)bVar4 == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x20e,"(m_isMultiBranch)","m_isMultiBranch");
        if (!bVar3) goto LAB_0061e394;
        *puVar6 = 0;
      }
      branchRef = IR::BranchInstr::AsMultiBrInstr(branchInstr);
      IR::LabelInstr::RemoveLabelRef(targetInstr,&branchRef->super_BranchInstr);
      if (pLVar7 != (LabelInstr *)0x0) {
        IR::LabelInstr::AddLabelRef(pLVar7,&branchRef->super_BranchInstr);
      }
    }
    else {
      if ((bool)bVar4 != false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x209,"(!m_isMultiBranch)","!m_isMultiBranch");
        if (!bVar3) goto LAB_0061e394;
        *puVar6 = 0;
        bVar4 = branchInstr->m_isMultiBranch;
      }
      if ((bVar4 & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0x1d3,"(!this->m_isMultiBranch)","!this->m_isMultiBranch");
        if (!bVar3) goto LAB_0061e394;
        *puVar6 = 0;
      }
      if (branchInstr->m_branchTarget != (LabelInstr *)0x0) {
        IR::LabelInstr::RemoveLabelRef(branchInstr->m_branchTarget,branchInstr);
      }
      if (pLVar7 != (LabelInstr *)0x0) {
        IR::LabelInstr::AddLabelRef(pLVar7,branchInstr);
      }
      branchInstr->m_branchTarget = pLVar7;
    }
    if (((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
         (targetInstr->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
         super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
         super_SListNodeBase<Memory::ArenaAllocator>.next == &targetInstr->labelRefs) &&
       ((targetInstr->field_0x78 & 4) == 0)) {
      PeepUnreachableLabel(targetInstr,false,(bool *)0x0);
    }
    instr = IR::Instr::GetNextRealInstr((Instr *)pLVar7);
    uVar10 = uVar10 + 1;
    targetInstr = pLVar7;
    if (instr->m_kind != InstrKindBranch) {
      return pLVar7;
    }
  } while( true );
}

Assistant:

IR::LabelInstr *
Peeps::RetargetBrToBr(IR::BranchInstr *branchInstr, IR::LabelInstr * targetInstr)
{
    AnalysisAssert(targetInstr);
    IR::Instr *targetInstrNext = targetInstr->GetNextRealInstr();
    AnalysisAssertMsg(targetInstrNext, "GetNextRealInstr() failed to get next target");

    // Removing branch to branch breaks some lexical assumptions about loop in sccliveness/linearscan/second chance.
    if (!branchInstr->IsLowered())
    {
        return targetInstr;
    }

    //
    // Retarget branch-to-branch
    //
#if DBG
    uint counter = 0;
#endif

    IR::LabelInstr *lastLoopTop = NULL;

    while (true)
    {
        // There's very few cases where we can safely follow a branch chain with intervening instrs.
        // One of them, which comes up occasionally, is where there is a copy of a single-def symbol
        // to another single-def symbol which is only used for the branch instruction (i.e. one dead
        // after the branch). Another is where a single-def symbol is declared of a constant (e.g. a
        // symbol created to store "True"
        // Unfortuantely, to properly do this, we'd need to do it somewhere else (i.e. not in peeps)
        // and make use of the additional information that we'd have there. Having the flow graph or
        // just any more information about variable liveness is necessary to determine that the load
        // instructions between jumps can be safely skipped.
        // The general case where this would be useful, on a higher level, is where a long statement
        // containing many branches returns a value; the branching here can put the result into some
        // different stacksym at each level, meaning that there'd be a load between each branch. The
        // result is that we don't currently optimize it.
        IR::BranchInstr *branchAtTarget = nullptr;
        if (targetInstrNext->IsBranchInstr())
        {
            branchAtTarget = targetInstrNext->AsBranchInstr();
        }
        else
        {
            // We don't have the information here to decide whether or not to continue the branch chain.
            break;
        }
        // This used to just be a targetInstrNext->AsBranchInstr()->IsUnconditional(), but, in order
        // to optimize further, it became necessary to handle more than just unconditional jumps. In
        // order to keep the code relatively clean, the "is it an inherently-taken jump chain" check
        // code now follows here:
        if (!targetInstrNext->AsBranchInstr()->IsUnconditional())
        {
            bool safetofollow = false;
            if(targetInstrNext->m_opcode == branchInstr->m_opcode)
            {
                // If it's the same branch instruction, with the same arguments, the branch decision should,
                // similarly, be the same. There's a bit more that can be done with this (e.g. for inverted,
                // but otherwise similar instructions like brTrue and brFalse, the destination could go down
                // the other path), but this is something that should probably be done more generally, so we
                // can optimize branch chains that have other interesting bechaviors.
                if (
                    (
                        (branchInstr->GetSrc1() && targetInstrNext->GetSrc1() && branchInstr->GetSrc1()->IsEqual(targetInstrNext->GetSrc1())) ||
                        !(branchInstr->GetSrc1() || targetInstrNext->GetSrc1())
                    ) && (
                        (branchInstr->GetSrc2() && targetInstrNext->GetSrc2() && branchInstr->GetSrc2()->IsEqual(targetInstrNext->GetSrc2())) ||
                        !(branchInstr->GetSrc2() || targetInstrNext->GetSrc2())
                    )
                   )
                {
                    safetofollow = true;
                }
            }
            if (!safetofollow)
            {
                // We can't say safely that this branch is something that we can implicitly take, so instead
                // cut off the branch chain optimization here.
                break;
            }
        }

        // We don't want to skip the loop entry, unless we're right before the encoder
        if (targetInstr->m_isLoopTop && !branchAtTarget->IsLowered())
        {
            break;
        }

        if (targetInstr->m_isLoopTop)
        {
            if (targetInstr == lastLoopTop)
            {
                // We are back to a loopTop already visited.
                // Looks like an infinite loop somewhere...
                break;
            }
            lastLoopTop = targetInstr;
        }
#if DBG
        if (!branchInstr->IsMultiBranch() && branchInstr->GetTarget()->m_noHelperAssert && !branchAtTarget->IsMultiBranch())
        {
            branchAtTarget->GetTarget()->m_noHelperAssert = true;
        }

        AssertMsg(++counter < 10000, "We should not be looping this many times!");
#endif

        IR::LabelInstr * reTargetLabel = branchAtTarget->GetTarget();
        AnalysisAssert(reTargetLabel);
        if (targetInstr == reTargetLabel)
        {
            // Infinite loop.
            //    JCC $L1
            // L1:
            //    JMP $L1
            break;
        }

        if(branchInstr->IsMultiBranch())
        {
            IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsMultiBrInstr();
            multiBranchInstr->ChangeLabelRef(targetInstr, reTargetLabel);
        }
        else
        {
            branchInstr->SetTarget(reTargetLabel);
        }

        if (targetInstr->IsUnreferenced())
        {
            Peeps::PeepUnreachableLabel(targetInstr, false);
        }

        targetInstr = reTargetLabel;
        targetInstrNext = targetInstr->GetNextRealInstr();
    }
    return targetInstr;
}